

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

tuple __thiscall
pybind11::
make_tuple<(pybind11::return_value_policy)1,pybind11::object&,pybind11::str,pybind11::int_>
          (pybind11 *this,object *args_,str *args__1,int_ *args__2)

{
  PyObject *pPVar1;
  undefined8 uVar2;
  long lVar3;
  cast_error *__return_storage_ptr__;
  unsigned_long __val;
  string *type;
  undefined1 local_c8 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  argtypes;
  object local_48;
  array<pybind11::object,_3UL> args;
  
  pPVar1 = (args_->super_handle).m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  local_48.super_handle.m_ptr = (handle)(handle)(args_->super_handle).m_ptr;
  pPVar1 = (args__1->super_object).super_handle.m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  args._M_elems[0].super_handle.m_ptr = (handle)(handle)(args__1->super_object).super_handle.m_ptr;
  pPVar1 = (args__2->super_object).super_handle.m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  args._M_elems[1].super_handle.m_ptr = (handle)(handle)(args__2->super_object).super_handle.m_ptr;
  type = (string *)local_c8;
  __val = 0;
  do {
    if (args._M_elems[__val - 1].super_handle.m_ptr == (PyObject *)0x0) {
      type_id<pybind11::object&>();
      type_id<pybind11::str>();
      type_id<pybind11::int_>();
      __return_storage_ptr__ = (cast_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string((string *)((long)&argtypes._M_elems[2].field_2 + 8),__val);
      cast_error_unable_to_convert_call_arg
                (__return_storage_ptr__,(string *)((long)&argtypes._M_elems[2].field_2 + 8),type);
      __cxa_throw(__return_storage_ptr__,&cast_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __val = __val + 1;
    type = type + 1;
  } while (__val != 3);
  tuple::tuple<unsigned_long,_0>((tuple *)this,3);
  lVar3 = 0;
  do {
    uVar2 = *(undefined8 *)((long)(args._M_elems + -1) + lVar3);
    *(undefined8 *)((long)(args._M_elems + -1) + lVar3) = 0;
    if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) == 0) {
      __assert_fail("PyTuple_Check(result.ptr())",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/pybind11/include/pybind11/cast.h"
                    ,0x40b,
                    "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::object &, pybind11::str, pybind11::int_>]"
                   );
    }
    *(undefined8 *)(*(long *)this + 0x18 + lVar3) = uVar2;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  lVar3 = 0x10;
  do {
    object::~object((object *)((long)(args._M_elems + -1) + lVar3));
    lVar3 = lVar3 + -8;
  } while (lVar3 != -8);
  return (object)(object)this;
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error_unable_to_convert_call_arg();
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error_unable_to_convert_call_arg(std::to_string(i), argtypes[i]);
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}